

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O0

bool check_sa_eqdss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
               (suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                *sa,string *str,comm *c)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  ulong local_80;
  size_t i;
  undefined1 local_58 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> true_sa;
  undefined1 local_38 [7];
  bool dss_correct;
  vector<unsigned_long,_std::allocator<unsigned_long>_> gsa;
  comm *c_local;
  string *str_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  *sa_local;
  
  gsa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)c;
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,&sa->local_SA,0,c);
  true_sa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  iVar3 = mxx::comm::rank((comm *)gsa.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar3 == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
    begin._M_current = (char *)std::__cxx11::string::begin();
    end._M_current = (char *)std::__cxx11::string::end();
    dss::construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long>
              (begin,end,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
    if (sVar4 == sVar5) {
      for (local_80 = 0;
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58),
          local_80 < sVar4; local_80 = local_80 + 1) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,
                            local_80);
        vVar1 = *pvVar6;
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                            local_80);
        if (vVar1 != *pvVar6) {
          true_sa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          break;
        }
      }
    }
    else {
      true_sa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
  }
  bVar2 = mxx::all_of((bool)(true_sa.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                      (comm *)gsa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  return bVar2;
}

Assistant:

bool check_sa_eqdss(suffix_array<Iterator, index_t, _LCP>& sa, const std::string& str, const mxx::comm& c) {
    // gather SA back to root process
    std::vector<index_t> gsa = mxx::gatherv(sa.local_SA, 0, c);

    // check correctness using dss
    bool dss_correct = true;
    if (c.rank() == 0) {
        std::vector<index_t> true_sa;
        dss::construct(str.begin(), str.end(), true_sa);
        if (true_sa.size() != gsa.size()) {
            dss_correct = false;
        } else {
            for (size_t i = 0; i < true_sa.size(); ++i) {
                if (true_sa[i] != gsa[i]) {
                    dss_correct = false;
                    break;
                }
            }
        }
    }
    return mxx::all_of(dss_correct, c);
}